

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::LogMessage::SaveOrSendToLog(LogMessage *this)

{
  size_t sVar1;
  LogMessageData *pLVar2;
  size_t sVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pLVar2 = this->data_;
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            (pLVar2->field_6).sink_;
  if (this_00 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
    sVar3 = pLVar2->num_chars_to_log_;
    if ((sVar3 == 0) || (pLVar2->message_text_[sVar3 - 1] != '\n')) {
      RawLog__(3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x637,"Check %s failed: %s",
               "data_->num_chars_to_log_ > 0 && data_->message_text_[data_->num_chars_to_log_-1] == \'\\n\'"
               ,"");
      pLVar2 = this->data_;
      this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                (pLVar2->field_6).sink_;
      sVar3 = pLVar2->num_chars_to_log_;
    }
    sVar1 = pLVar2->num_prefix_chars_;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,pLVar2->message_text_ + sVar1,
               pLVar2->message_text_ + (long)(int)((int)sVar3 + ~(uint)sVar1) + sVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  SendToLog(this);
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->outvec_ != NULL) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
               data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");
    // Omit prefix of message and trailing newline when recording in outvec_.
    const char *start = data_->message_text_ + data_->num_prefix_chars_;
    int len = data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1;
    data_->outvec_->push_back(string(start, len));
  } else {
    SendToLog();
  }
}